

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O0

void Ifn_ManSatDeriveOne(sat_solver *pSat,Vec_Int_t *vPiVars,Vec_Int_t *vValues)

{
  int iVar1;
  undefined4 local_24;
  int iVar;
  int i;
  Vec_Int_t *vValues_local;
  Vec_Int_t *vPiVars_local;
  sat_solver *pSat_local;
  
  Vec_IntClear(vValues);
  for (local_24 = 0; iVar1 = Vec_IntSize(vPiVars), local_24 < iVar1; local_24 = local_24 + 1) {
    iVar1 = Vec_IntEntry(vPiVars,local_24);
    iVar1 = sat_solver_var_value(pSat,iVar1);
    Vec_IntPush(vValues,iVar1);
  }
  return;
}

Assistant:

void Ifn_ManSatDeriveOne( sat_solver * pSat, Vec_Int_t * vPiVars, Vec_Int_t * vValues )
{
    int i, iVar;
    Vec_IntClear( vValues );
    Vec_IntForEachEntry( vPiVars, iVar, i )
        Vec_IntPush( vValues, sat_solver_var_value(pSat, iVar) );
}